

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CropResizeLayerParams::_InternalParse
          (CropResizeLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  BoxCoordinatesMode *msg;
  uint64_t value;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  Arena *pAVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  float *local_40;
  RepeatedField<unsigned_long> *local_38;
  
  local_40 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->targetsize_;
    do {
      bVar1 = *(byte *)local_40;
      uVar5 = (uint)bVar1;
      p = (float *)((long)local_40 + 1);
      if ((char)bVar1 < '\0') {
        uVar5 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar5);
          p = (float *)pVar7.first;
          uVar5 = pVar7.second;
        }
        else {
          p = (float *)((long)local_40 + 2);
        }
      }
      cVar4 = (char)uVar5;
      local_40 = p;
      switch(uVar5 >> 3) {
      case 1:
        if (cVar4 == '\n') {
          local_40 = (float *)google::protobuf::internal::PackedUInt64Parser(local_38,(char *)p,ctx)
          ;
        }
        else {
          if ((uVar5 & 0xff) != 8) break;
          value = google::protobuf::internal::ReadVarint64((char **)&local_40);
          _internal_add_targetsize(this,value);
        }
        goto joined_r0x002734bc;
      case 2:
        if (cVar4 != '\x10') break;
        uVar3 = (ulong)(char)*(byte *)p;
        local_40 = (float *)((long)p + 1);
        if ((long)uVar3 < 0) {
          uVar5 = ((uint)*(byte *)local_40 * 0x80 + (uint)*(byte *)p) - 0x80;
          if ((char)*(byte *)local_40 < '\0') {
            local_40 = p;
            pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar5);
            local_40 = (float *)pVar8.first;
            this->normalizedcoordinates_ = pVar8.second != 0;
            goto joined_r0x002734bc;
          }
          uVar3 = (ulong)uVar5;
          local_40 = (float *)((long)p + 2);
        }
        this->normalizedcoordinates_ = uVar3 != 0;
        goto LAB_002734be;
      case 3:
        if (cVar4 != '\x1a') break;
        msg = (BoxCoordinatesMode *)this->mode_;
        if (msg == (BoxCoordinatesMode *)0x0) {
          pAVar6 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            pAVar6 = *(Arena **)pAVar6;
          }
          msg = (BoxCoordinatesMode *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SamplingMode>
                          (pAVar6);
          this->mode_ = (SamplingMode *)msg;
        }
LAB_002733f9:
        local_40 = (float *)google::protobuf::internal::ParseContext::ParseMessage
                                      (ctx,&msg->super_MessageLite,(char *)local_40);
        goto joined_r0x002734bc;
      case 4:
        if (cVar4 == '\"') {
          msg = this->boxindicesmode_;
          if (msg == (BoxCoordinatesMode *)0x0) {
            pAVar6 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar6 = *(Arena **)pAVar6;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::BoxCoordinatesMode>(pAVar6);
            this->boxindicesmode_ = msg;
          }
          goto LAB_002733f9;
        }
        break;
      case 5:
        if (cVar4 == '-') {
          this->spatialscale_ = *p;
          local_40 = p + 1;
          goto LAB_002734be;
        }
      }
      if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
        if (p == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
        return (char *)p;
      }
      if ((this_00->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_40 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (uVar5,unknown,(char *)local_40,ctx);
joined_r0x002734bc:
      if (local_40 == (float *)0x0) {
        return (char *)0x0;
      }
LAB_002734be:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_40;
}

Assistant:

const char* CropResizeLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated uint64 targetSize = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_targetsize(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_targetsize(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool normalizedCoordinates = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          normalizedcoordinates_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.SamplingMode mode = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_mode(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_boxindicesmode(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float spatialScale = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 45)) {
          spatialscale_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}